

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void OPNSetPres(FM_OPN *OPN,int pres,int timer_prescaler,int SSGpres)

{
  double local_28;
  int SSGpres_local;
  int timer_prescaler_local;
  int pres_local;
  FM_OPN *OPN_local;
  
  if (((OPN->smpRateNative != '\0') && (OPN->smpRateFunc != (DEVCB_SRATE_CHG)0x0)) &&
     ((OPN->ST).rate = (OPN->ST).clock / (uint)pres, OPN->smpRateFunc != (DEVCB_SRATE_CHG)0x0)) {
    (*OPN->smpRateFunc)(OPN->smpRateData,(OPN->ST).rate);
  }
  if ((OPN->ST).rate == 0) {
    local_28 = 0.0;
  }
  else {
    local_28 = ((double)(OPN->ST).clock / (double)(OPN->ST).rate) / (double)pres;
  }
  (OPN->ST).freqbase = local_28;
  if (ABS((OPN->ST).freqbase - 1.0) < 5e-05) {
    (OPN->ST).freqbase = 1.0;
  }
  OPN->eg_timer_add = (UINT32)(long)((OPN->ST).freqbase * 65536.0);
  OPN->eg_timer_overflow = 0x30000;
  OPN->lfo_timer_add = (UINT32)(long)((OPN->ST).freqbase * 16777216.0);
  (OPN->ST).timer_prescaler = timer_prescaler;
  if (SSGpres != 0) {
    (*(OPN->ST).SSG_funcs.set_clock)((OPN->ST).SSG_param,((OPN->ST).clock << 1) / (uint)SSGpres);
  }
  init_timetables(OPN);
  return;
}

Assistant:

static void OPNSetPres(FM_OPN *OPN, int pres, int timer_prescaler, int SSGpres)
{
	if (OPN->smpRateNative && OPN->smpRateFunc != NULL)
	{
		OPN->ST.rate = OPN->ST.clock / pres;
		if (OPN->smpRateFunc != NULL)
			OPN->smpRateFunc(OPN->smpRateData, OPN->ST.rate);
	}

	/* frequency base */
	OPN->ST.freqbase = (OPN->ST.rate) ? ((double)OPN->ST.clock / OPN->ST.rate) / pres : 0;
	if (fabs(OPN->ST.freqbase - 1.0) < 0.00005)
		OPN->ST.freqbase = 1.0;

#if 0
	OPN->ST.rate = (double)OPN->ST.clock / pres;
	OPN->ST.freqbase = 1.0;
#endif

	/* EG is updated every 3 samples */
	OPN->eg_timer_add  = (UINT32)((1<<EG_SH) * OPN->ST.freqbase);
	OPN->eg_timer_overflow = ( 3 ) * (1<<EG_SH);

	/* LFO timer increment (every samples) */
	OPN->lfo_timer_add  = (UINT32)((1<<LFO_SH) * OPN->ST.freqbase);

	/* Timer base time */
	OPN->ST.timer_prescaler = timer_prescaler;

	/* SSG part  prescaler set */
	if( SSGpres ) OPN->ST.SSG_funcs.set_clock( OPN->ST.SSG_param, OPN->ST.clock * 2 / SSGpres );

	/* make time tables */
	init_timetables( OPN );
}